

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_blob_open(sqlite3 *db,char *zDb,char *zTable,char *zColumn,sqlite_int64 iRow,int flags,
                     sqlite3_blob **ppBlob)

{
  Schema *pSVar1;
  Op *pOVar2;
  uint p2;
  char *p;
  sqlite3 *db_00;
  sqlite_int64 iRow_00;
  int iVar3;
  int addr;
  uint uVar4;
  Incrblob *p_00;
  Table *pTVar5;
  FKey *pFVar6;
  Index *pIVar7;
  Vdbe *p_01;
  uint uVar8;
  long lVar9;
  Schema **ppSVar10;
  uint uVar11;
  Vdbe *v;
  int p1;
  Column *pCVar12;
  char *pcVar13;
  ulong uVar14;
  char *zErr;
  Parse *local_a0;
  char *local_90;
  uint local_84;
  sqlite3 *local_80;
  int local_74;
  Table *local_70;
  Incrblob *local_68;
  uint local_60;
  uint local_5c;
  char *local_58;
  ulong local_50;
  sqlite_int64 local_48;
  char *local_40;
  char *local_38;
  
  local_90 = (char *)0x0;
  *ppBlob = (sqlite3_blob *)0x0;
  local_74 = flags;
  local_58 = zColumn;
  local_48 = iRow;
  local_40 = zDb;
  local_38 = zTable;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  p_00 = (Incrblob *)sqlite3DbMallocRaw(db,0x28);
  if (p_00 != (Incrblob *)0x0) {
    p_00->pCsr = (BtCursor *)0x0;
    p_00->pStmt = (sqlite3_stmt *)0x0;
    p_00->flags = 0;
    p_00->nByte = 0;
    p_00->iOffset = 0;
    p_00->iCol = 0;
    p_00->db = (sqlite3 *)0x0;
    local_a0 = (Parse *)sqlite3DbMallocRaw(db,0x288);
    if (local_a0 != (Parse *)0x0) {
      p2 = (uint)(flags != 0);
      local_60 = local_74 != 0 ^ 3;
      local_50 = (ulong)(local_74 != 0 | 2);
      uVar11 = 0;
      uVar8 = 0;
      local_80 = db;
      local_68 = p_00;
      do {
        local_84 = uVar8;
        local_5c = uVar11;
        memset(local_a0,0,0x288);
        local_a0->db = db;
        sqlite3DbFree(db,local_90);
        local_90 = (char *)0x0;
        sqlite3BtreeEnterAll(db);
        pcVar13 = local_38;
        pTVar5 = sqlite3LocateTable(local_a0,0,local_38,local_40);
        if (pTVar5 == (Table *)0x0) {
LAB_0011431e:
          pTVar5 = (Table *)0x0;
        }
        else if ((pTVar5->tabFlags & 0x10) != 0) {
          sqlite3ErrorMsg(local_a0,"cannot open virtual table: %s",pcVar13);
          goto LAB_0011431e;
        }
        if (pTVar5 == (Table *)0x0) {
LAB_00114343:
          pTVar5 = (Table *)0x0;
        }
        else if ((pTVar5->tabFlags & 0x20) != 0) {
          sqlite3ErrorMsg(local_a0,"cannot open table without rowid: %s",pcVar13);
          goto LAB_00114343;
        }
        if (pTVar5 == (Table *)0x0) {
LAB_00114368:
          pTVar5 = (Table *)0x0;
        }
        else if (pTVar5->pSelect != (Select *)0x0) {
          sqlite3ErrorMsg(local_a0,"cannot open view: %s",pcVar13);
          goto LAB_00114368;
        }
        if (pTVar5 == (Table *)0x0) {
          if (local_a0->zErrMsg != (char *)0x0) {
            sqlite3DbFree(db,(void *)0x0);
            local_90 = local_a0->zErrMsg;
            local_a0->zErrMsg = (char *)0x0;
          }
LAB_00114719:
          sqlite3BtreeLeaveAll(db);
          uVar4 = 1;
          break;
        }
        uVar11 = (uint)pTVar5->nCol;
        if (pTVar5->nCol < 1) {
          uVar8 = 0;
        }
        else {
          pCVar12 = pTVar5->aCol;
          uVar14 = 0;
          local_70 = pTVar5;
          do {
            iVar3 = sqlite3_stricmp(pCVar12->zName,local_58);
            if (iVar3 == 0) goto LAB_001143ac;
            uVar14 = uVar14 + 1;
            pCVar12 = pCVar12 + 1;
          } while (uVar11 != uVar14);
          uVar14 = (ulong)uVar11;
LAB_001143ac:
          uVar8 = (uint)uVar14;
          pTVar5 = local_70;
          db = local_80;
        }
        db_00 = local_80;
        if (uVar8 == uVar11) {
          sqlite3DbFree(db,(void *)0x0);
          local_90 = sqlite3MPrintf(db,"no such column: \"%s\"",local_58);
          p_00 = local_68;
          goto LAB_00114719;
        }
        if (local_74 != 0) {
          if (((db->flags & 0x80000) == 0) || (pFVar6 = pTVar5->pFKey, pFVar6 == (FKey *)0x0)) {
            pcVar13 = (char *)0x0;
          }
          else {
            pcVar13 = (char *)0x0;
            do {
              if (0 < (long)pFVar6->nCol) {
                lVar9 = 0;
                do {
                  if (*(uint *)((long)&pFVar6->aCol[0].iFrom + lVar9) == uVar8) {
                    pcVar13 = "foreign key";
                  }
                  lVar9 = lVar9 + 0x10;
                } while ((long)pFVar6->nCol * 0x10 != lVar9);
              }
              pFVar6 = pFVar6->pNextFrom;
            } while (pFVar6 != (FKey *)0x0);
          }
          for (pIVar7 = pTVar5->pIndex; pIVar7 != (Index *)0x0; pIVar7 = pIVar7->pNext) {
            if ((ulong)pIVar7->nKeyCol != 0) {
              uVar14 = 0;
              do {
                if (uVar8 == (int)pIVar7->aiColumn[uVar14]) {
                  pcVar13 = "indexed";
                }
                uVar14 = uVar14 + 1;
              } while (pIVar7->nKeyCol != uVar14);
            }
          }
          db = local_80;
          if (pcVar13 != (char *)0x0) {
            sqlite3DbFree(local_80,(void *)0x0);
            local_90 = sqlite3MPrintf(db_00,"cannot open %s column for writing",pcVar13);
            sqlite3BtreeLeaveAll(db_00);
            local_84 = 1;
            p_00 = local_68;
            db = local_80;
            uVar4 = local_84;
            break;
          }
        }
        p_01 = sqlite3VdbeCreate(local_a0);
        local_68->pStmt = (sqlite3_stmt *)p_01;
        if (p_01 != (Vdbe *)0x0) {
          pSVar1 = pTVar5->pSchema;
          if (pSVar1 == (Schema *)0x0) {
            uVar14 = 0xfff0bdc0;
          }
          else {
            uVar11 = db->nDb;
            if ((int)uVar11 < 1) {
              uVar14 = 0;
            }
            else {
              ppSVar10 = &db->aDb->pSchema;
              uVar14 = 0;
              do {
                if (*ppSVar10 == pSVar1) goto LAB_001144ef;
                uVar14 = uVar14 + 1;
                ppSVar10 = ppSVar10 + 4;
              } while (uVar11 != uVar14);
              uVar14 = (ulong)uVar11;
            }
          }
LAB_001144ef:
          local_70 = (Table *)(long)pSVar1->iGeneration;
          p1 = (int)uVar14;
          addr = sqlite3VdbeAddOp3(p_01,4,p1,p2,pSVar1->schema_cookie);
          iVar3 = -0xe;
          sqlite3VdbeChangeP4(p_01,addr,(char *)local_70,-0xe);
          if (p_01->aOp != (Op *)0x0) {
            iVar3 = p_01->nOp * 3;
            p_01->aOp[(long)p_01->nOp + -1].p5 = '\x01';
          }
          sqlite3VdbeAddOpList(p_01,10,sqlite3_blob_open::openBlob,iVar3);
          uVar11 = 1 << ((byte)uVar14 & 0x1f);
          p_01->btreeMask = p_01->btreeMask | uVar11;
          if ((p1 != 1) && ((p_01->db->aDb[p1].pBt)->sharable != '\0')) {
            p_01->lockMask = p_01->lockMask | uVar11;
          }
          if (1 < (uint)p_01->nOp) {
            p_01->aOp[1].p1 = p1;
            pOVar2 = p_01->aOp;
            pOVar2[1].p2 = pTVar5->tnum;
            pOVar2[1].p3 = p2;
          }
          sqlite3VdbeChangeP4(p_01,1,pTVar5->zName,0);
          sqlite3VdbeChangeToNoop(p_01,local_60);
          if ((uint)local_50 < (uint)p_01->nOp) {
            pOVar2 = p_01->aOp;
            pOVar2[local_50].p2 = pTVar5->tnum;
            pOVar2[local_50].p3 = p1;
          }
          sqlite3VdbeChangeP4(p_01,(uint)local_50,(char *)((long)pTVar5->nCol + 1),-0xe);
          db = local_80;
          if (6 < (uint)p_01->nOp) {
            p_01->aOp[6].p2 = (int)pTVar5->nCol;
          }
          if (local_80->mallocFailed == '\0') {
            local_a0->nVar = 1;
            local_a0->nTab = 1;
            local_a0->nMem = 1;
            sqlite3VdbeMakeReady(p_01,local_a0);
          }
        }
        p_00 = local_68;
        local_68->flags = p2;
        local_68->iCol = uVar8;
        local_68->db = db;
        sqlite3BtreeLeaveAll(db);
        iRow_00 = local_48;
        uVar4 = local_84;
        if (db->mallocFailed != '\0') break;
        sqlite3_bind_int64(p_00->pStmt,1,local_48);
        uVar4 = blobSeekToRow(p_00,iRow_00,&local_90);
        if (0x30 < local_5c) break;
        uVar11 = local_5c + 1;
        uVar8 = 0x11;
      } while (uVar4 == 0x11);
      goto LAB_00114738;
    }
  }
  local_a0 = (Parse *)0x0;
  uVar4 = 0;
LAB_00114738:
  if ((uVar4 == 0) && (db->mallocFailed == '\0')) {
    *ppBlob = (sqlite3_blob *)p_00;
  }
  else {
    if ((p_00 != (Incrblob *)0x0) && ((Vdbe *)p_00->pStmt != (Vdbe *)0x0)) {
      sqlite3VdbeFinalize((Vdbe *)p_00->pStmt);
    }
    sqlite3DbFree(db,p_00);
  }
  p = local_90;
  pcVar13 = "%s";
  if (local_90 == (char *)0x0) {
    pcVar13 = (char *)0x0;
  }
  sqlite3ErrorWithMsg(db,uVar4,pcVar13,local_90);
  sqlite3DbFree(db,p);
  sqlite3ParserReset(local_a0);
  sqlite3DbFree(db,local_a0);
  if (db == (sqlite3 *)0x0) {
    uVar4 = uVar4 & 0xff;
  }
  else if ((uVar4 == 0xc0a) || (db->mallocFailed != '\0')) {
    apiOomError(db);
    uVar4 = 7;
  }
  else {
    uVar4 = uVar4 & db->errMask;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return uVar4;
}

Assistant:

SQLITE_STDCALL sqlite3_blob_open(
  sqlite3* db,            /* The database connection */
  const char *zDb,        /* The attached database containing the blob */
  const char *zTable,     /* The table containing the blob */
  const char *zColumn,    /* The column containing the blob */
  sqlite_int64 iRow,      /* The row containing the glob */
  int flags,              /* True -> read/write access, false -> read-only */
  sqlite3_blob **ppBlob   /* Handle for accessing the blob returned here */
){
  int nAttempt = 0;
  int iCol;               /* Index of zColumn in row-record */

  /* This VDBE program seeks a btree cursor to the identified 
  ** db/table/row entry. The reason for using a vdbe program instead
  ** of writing code to use the b-tree layer directly is that the
  ** vdbe program will take advantage of the various transaction,
  ** locking and error handling infrastructure built into the vdbe.
  **
  ** After seeking the cursor, the vdbe executes an OP_ResultRow.
  ** Code external to the Vdbe then "borrows" the b-tree cursor and
  ** uses it to implement the blob_read(), blob_write() and 
  ** blob_bytes() functions.
  **
  ** The sqlite3_blob_close() function finalizes the vdbe program,
  ** which closes the b-tree cursor and (possibly) commits the 
  ** transaction.
  */
  static const int iLn = VDBE_OFFSET_LINENO(4);
  static const VdbeOpList openBlob[] = {
    /* {OP_Transaction, 0, 0, 0},  // 0: Inserted separately */
    {OP_TableLock, 0, 0, 0},       /* 1: Acquire a read or write lock */
    /* One of the following two instructions is replaced by an OP_Noop. */
    {OP_OpenRead, 0, 0, 0},        /* 2: Open cursor 0 for reading */
    {OP_OpenWrite, 0, 0, 0},       /* 3: Open cursor 0 for read/write */
    {OP_Variable, 1, 1, 1},        /* 4: Push the rowid to the stack */
    {OP_NotExists, 0, 10, 1},      /* 5: Seek the cursor */
    {OP_Column, 0, 0, 1},          /* 6  */
    {OP_ResultRow, 1, 0, 0},       /* 7  */
    {OP_Goto, 0, 4, 0},            /* 8  */
    {OP_Close, 0, 0, 0},           /* 9  */
    {OP_Halt, 0, 0, 0},            /* 10 */
  };

  int rc = SQLITE_OK;
  char *zErr = 0;
  Table *pTab;
  Parse *pParse = 0;
  Incrblob *pBlob = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppBlob==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  *ppBlob = 0;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTable==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  flags = !!flags;                /* flags = (flags ? 1 : 0); */

  sqlite3_mutex_enter(db->mutex);

  pBlob = (Incrblob *)sqlite3DbMallocZero(db, sizeof(Incrblob));
  if( !pBlob ) goto blob_open_out;
  pParse = sqlite3StackAllocRaw(db, sizeof(*pParse));
  if( !pParse ) goto blob_open_out;

  do {
    memset(pParse, 0, sizeof(Parse));
    pParse->db = db;
    sqlite3DbFree(db, zErr);
    zErr = 0;

    sqlite3BtreeEnterAll(db);
    pTab = sqlite3LocateTable(pParse, 0, zTable, zDb);
    if( pTab && IsVirtual(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open virtual table: %s", zTable);
    }
    if( pTab && !HasRowid(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open table without rowid: %s", zTable);
    }
#ifndef SQLITE_OMIT_VIEW
    if( pTab && pTab->pSelect ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open view: %s", zTable);
    }
#endif
    if( !pTab ){
      if( pParse->zErrMsg ){
        sqlite3DbFree(db, zErr);
        zErr = pParse->zErrMsg;
        pParse->zErrMsg = 0;
      }
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* Now search pTab for the exact column. */
    for(iCol=0; iCol<pTab->nCol; iCol++) {
      if( sqlite3StrICmp(pTab->aCol[iCol].zName, zColumn)==0 ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      sqlite3DbFree(db, zErr);
      zErr = sqlite3MPrintf(db, "no such column: \"%s\"", zColumn);
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* If the value is being opened for writing, check that the
    ** column is not indexed, and that it is not part of a foreign key. 
    ** It is against the rules to open a column to which either of these
    ** descriptions applies for writing.  */
    if( flags ){
      const char *zFault = 0;
      Index *pIdx;
#ifndef SQLITE_OMIT_FOREIGN_KEY
      if( db->flags&SQLITE_ForeignKeys ){
        /* Check that the column is not part of an FK child key definition. It
        ** is not necessary to check if it is part of a parent key, as parent
        ** key columns must be indexed. The check below will pick up this 
        ** case.  */
        FKey *pFKey;
        for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
          int j;
          for(j=0; j<pFKey->nCol; j++){
            if( pFKey->aCol[j].iFrom==iCol ){
              zFault = "foreign key";
            }
          }
        }
      }
#endif
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        int j;
        for(j=0; j<pIdx->nKeyCol; j++){
          if( pIdx->aiColumn[j]==iCol ){
            zFault = "indexed";
          }
        }
      }
      if( zFault ){
        sqlite3DbFree(db, zErr);
        zErr = sqlite3MPrintf(db, "cannot open %s column for writing", zFault);
        rc = SQLITE_ERROR;
        sqlite3BtreeLeaveAll(db);
        goto blob_open_out;
      }
    }

    pBlob->pStmt = (sqlite3_stmt *)sqlite3VdbeCreate(pParse);
    assert( pBlob->pStmt || db->mallocFailed );
    if( pBlob->pStmt ){
      Vdbe *v = (Vdbe *)pBlob->pStmt;
      int iDb = sqlite3SchemaToIndex(db, pTab->pSchema);


      sqlite3VdbeAddOp4Int(v, OP_Transaction, iDb, flags, 
                           pTab->pSchema->schema_cookie,
                           pTab->pSchema->iGeneration);
      sqlite3VdbeChangeP5(v, 1);     
      sqlite3VdbeAddOpList(v, ArraySize(openBlob), openBlob, iLn);

      /* Make sure a mutex is held on the table to be accessed */
      sqlite3VdbeUsesBtree(v, iDb); 

      /* Configure the OP_TableLock instruction */
#ifdef SQLITE_OMIT_SHARED_CACHE
      sqlite3VdbeChangeToNoop(v, 1);
#else
      sqlite3VdbeChangeP1(v, 1, iDb);
      sqlite3VdbeChangeP2(v, 1, pTab->tnum);
      sqlite3VdbeChangeP3(v, 1, flags);
      sqlite3VdbeChangeP4(v, 1, pTab->zName, P4_TRANSIENT);
#endif

      /* Remove either the OP_OpenWrite or OpenRead. Set the P2 
      ** parameter of the other to pTab->tnum.  */
      sqlite3VdbeChangeToNoop(v, 3 - flags);
      sqlite3VdbeChangeP2(v, 2 + flags, pTab->tnum);
      sqlite3VdbeChangeP3(v, 2 + flags, iDb);

      /* Configure the number of columns. Configure the cursor to
      ** think that the table has one more column than it really
      ** does. An OP_Column to retrieve this imaginary column will
      ** always return an SQL NULL. This is useful because it means
      ** we can invoke OP_Column to fill in the vdbe cursors type 
      ** and offset cache without causing any IO.
      */
      sqlite3VdbeChangeP4(v, 2+flags, SQLITE_INT_TO_PTR(pTab->nCol+1),P4_INT32);
      sqlite3VdbeChangeP2(v, 6, pTab->nCol);
      if( !db->mallocFailed ){
        pParse->nVar = 1;
        pParse->nMem = 1;
        pParse->nTab = 1;
        sqlite3VdbeMakeReady(v, pParse);
      }
    }
   
    pBlob->flags = flags;
    pBlob->iCol = iCol;
    pBlob->db = db;
    sqlite3BtreeLeaveAll(db);
    if( db->mallocFailed ){
      goto blob_open_out;
    }
    sqlite3_bind_int64(pBlob->pStmt, 1, iRow);
    rc = blobSeekToRow(pBlob, iRow, &zErr);
  } while( (++nAttempt)<SQLITE_MAX_SCHEMA_RETRY && rc==SQLITE_SCHEMA );

blob_open_out:
  if( rc==SQLITE_OK && db->mallocFailed==0 ){
    *ppBlob = (sqlite3_blob *)pBlob;
  }else{
    if( pBlob && pBlob->pStmt ) sqlite3VdbeFinalize((Vdbe *)pBlob->pStmt);
    sqlite3DbFree(db, pBlob);
  }
  sqlite3ErrorWithMsg(db, rc, (zErr ? "%s" : 0), zErr);
  sqlite3DbFree(db, zErr);
  sqlite3ParserReset(pParse);
  sqlite3StackFree(db, pParse);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}